

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  type tVar1;
  type __buf_00;
  ulong uVar2;
  undefined4 in_register_00000034;
  bool bVar3;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> local_48 [3];
  byte local_2d;
  Error local_2c;
  bool ret;
  Error error;
  type res;
  Request *req_local;
  ClientImpl *this_local;
  
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)__buf
  ;
  detail::make_unique<httplib::Response>();
  tVar1._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
       _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  local_2c = Success;
  __buf_00 = std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::operator*
                       ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
                        &stack0xffffffffffffffd8);
  uVar2 = send((ClientImpl *)CONCAT44(in_register_00000034,__fd),
               (int)tVar1._M_t.
                    super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                    .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,__buf_00,
               (size_t)&local_2c,__flags);
  local_2d = (byte)uVar2 & 1;
  bVar3 = (uVar2 & 1) == 0;
  if (bVar3) {
    std::unique_ptr<httplib::Response,std::default_delete<httplib::Response>>::
    unique_ptr<std::default_delete<httplib::Response>,void>
              ((unique_ptr<httplib::Response,std::default_delete<httplib::Response>> *)local_48,
               (nullptr_t)0x0);
  }
  else {
    std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::unique_ptr
              (local_48,(unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
                        &stack0xffffffffffffffd8);
  }
  Result::Result((Result *)this,local_48,local_2c);
  if (bVar3) {
    std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
              (local_48);
  }
  else {
    std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
              (local_48);
  }
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)
             &stack0xffffffffffffffd8);
  return (ssize_t)this;
}

Assistant:

inline Result ClientImpl::send(const Request &req) {
		auto res = detail::make_unique<Response>();
		auto error = Error::Success;
		auto ret = send(req, *res, error);
		return Result{ret ? std::move(res) : nullptr, error};
	}